

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall helics::FederateState::processDataMessage(FederateState *this,ActionMessage *cmd)

{
  uint16_t uVar1;
  ushort uVar2;
  int32_t iVar3;
  Time messageUpdateTime;
  Time messageUpdateTime_00;
  Time valueUpdateTime;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view logMessageSource;
  string_view logMessageSource_00;
  string_view logMessageSource_01;
  string_view logMessageSource_02;
  string_view logMessageSource_03;
  string_view logMessageSource_04;
  string_view logMessageSource_05;
  ActionMessage *pAVar4;
  bool bVar5;
  FederateStates FVar6;
  action_t aVar7;
  pointer pTVar8;
  GlobalHandle GVar9;
  EndpointInfo *pEVar10;
  pointer pMVar11;
  iterator iVar12;
  undefined8 uVar13;
  string *x;
  ActionMessage *in_RSI;
  long in_RDI;
  __sv_type _Var14;
  Time valueTime;
  GlobalHandle *src;
  iterator __end3;
  iterator __begin3;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__range3;
  __single_object mess;
  EndpointInfo *eptI;
  InputInfo *subI;
  string qres;
  EndpointInfo *epi;
  FederateState *in_stack_00000598;
  string_view in_stack_000005a0;
  undefined4 in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8e8;
  InputInfo *in_stack_fffffffffffff8f0;
  size_type in_stack_fffffffffffff8f8;
  GlobalHandle source;
  undefined4 in_stack_fffffffffffff900;
  undefined4 in_stack_fffffffffffff904;
  undefined1 uVar15;
  TimeCoordinator *in_stack_fffffffffffff908;
  TimeCoordinator *this_00;
  undefined4 in_stack_fffffffffffff910;
  InterfaceHandle in_stack_fffffffffffff914;
  uint uVar16;
  SmallBuffer *in_stack_fffffffffffff918;
  ActionMessage *in_stack_fffffffffffff958;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_fffffffffffff968;
  EndpointInfo *in_stack_fffffffffffff970;
  undefined1 local_648 [32];
  char *local_628;
  undefined8 local_620;
  undefined1 local_618 [16];
  shared_ptr<const_helics::SmallBuffer> *in_stack_fffffffffffff9f8;
  uint in_stack_fffffffffffffa04;
  undefined1 in_stack_fffffffffffffa08 [16];
  GlobalHandle source_id;
  undefined1 in_stack_fffffffffffffa18 [16];
  __sv_type local_5b8;
  __sv_type local_5a8;
  undefined8 local_598;
  undefined8 in_stack_fffffffffffffa80;
  undefined8 uVar17;
  undefined8 in_stack_fffffffffffffa88;
  undefined8 this_01;
  GlobalFederateId in_stack_fffffffffffffa90;
  GlobalFederateId id;
  undefined4 in_stack_fffffffffffffa94;
  GlobalFederateId id_00;
  undefined8 in_stack_fffffffffffffa98;
  undefined8 uVar18;
  undefined8 in_stack_fffffffffffffaa0;
  pointer in_stack_fffffffffffffaa8;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  local_550;
  pointer local_548;
  Time local_530;
  Time local_528;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_520 [4];
  pointer local_500;
  pointer local_4f8;
  undefined1 local_4f0 [32];
  __sv_type local_4d0;
  format_args in_stack_fffffffffffffb40;
  string_view in_stack_fffffffffffffb50;
  undefined1 local_480 [32];
  undefined8 command;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffba0;
  pointer local_3c0;
  pointer local_3b8;
  undefined1 local_3b0 [32];
  char *local_390;
  undefined8 local_388;
  undefined1 local_380 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  __sv_type local_350;
  undefined1 local_330 [32];
  char *local_310;
  undefined8 local_308;
  undefined1 local_300 [32];
  __sv_type local_2e0;
  __sv_type local_2d0;
  baseType local_2c0;
  BaseType local_2b4;
  EndpointInfo *local_2b0;
  ActionMessage *local_2a8;
  undefined1 local_298 [16];
  undefined8 local_288;
  undefined1 *local_280;
  char *local_278;
  undefined8 uStack_270;
  EndpointInfo *local_268;
  char *local_260;
  undefined8 uStack_258;
  undefined1 *local_250;
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined1 *local_230;
  char *local_228;
  undefined8 uStack_220;
  undefined1 *local_218;
  char *local_210;
  undefined8 uStack_208;
  undefined1 *local_200;
  undefined1 local_1f8 [16];
  baseType local_1e8 [2];
  baseType local_1d8 [2];
  undefined8 local_1c8;
  undefined1 *local_1c0;
  pointer local_1b8;
  pointer psStack_1b0;
  Time *local_1a8;
  Time *local_1a0;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *local_198;
  pointer local_190;
  pointer psStack_188;
  undefined1 *local_180;
  undefined1 local_178 [16];
  pointer local_168 [2];
  pointer local_158 [2];
  undefined8 local_148;
  undefined1 *local_140;
  __pthread_internal_list *local_138;
  __pthread_internal_list *p_Stack_130;
  pointer *local_128;
  pointer *local_120;
  undefined1 *local_118;
  __pthread_internal_list *local_110;
  __pthread_internal_list *p_Stack_108;
  undefined1 *local_100;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined8 uStack_c0;
  string *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined8 uStack_a0;
  undefined1 *local_98;
  pointer local_90;
  pointer *local_88;
  pointer local_80;
  pointer *local_78;
  baseType local_70;
  baseType *local_68;
  baseType local_60;
  baseType *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_2a8 = in_RSI;
  aVar7 = ActionMessage::action(in_RSI);
  uVar17 = in_stack_fffffffffffffba0._M_allocated_capacity;
  if (aVar7 == cmd_pub) {
    GVar9 = (GlobalHandle)
            InterfaceInfo::getInput
                      ((InterfaceInfo *)in_stack_fffffffffffff908,in_stack_fffffffffffff914);
    uVar15 = (undefined1)((uint)in_stack_fffffffffffff904 >> 0x18);
    uVar17 = in_stack_fffffffffffffba0._M_allocated_capacity;
    if (GVar9 == (GlobalHandle)0x0) {
      pEVar10 = InterfaceInfo::getEndpoint
                          ((InterfaceInfo *)in_stack_fffffffffffff908,in_stack_fffffffffffff914);
      if (pEVar10 != (EndpointInfo *)0x0) {
        std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
        operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                    *)0x4ed596);
        messageUpdateTime_00.internalTimeCode._4_4_ = in_stack_fffffffffffff914.hid;
        messageUpdateTime_00.internalTimeCode._0_4_ = in_stack_fffffffffffff910;
        TimeCoordinator::updateMessageTime
                  (in_stack_fffffffffffff908,messageUpdateTime_00,(bool)uVar15);
        if (0x11 < *(int *)(in_RDI + 0x290)) {
          std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff8e0);
          in_stack_fffffffffffff970 = (EndpointInfo *)&stack0xfffffffffffffb50;
          prettyPrintString_abi_cxx11_((ActionMessage *)uVar17);
          local_250 = local_480;
          local_260 = "receive_message {}";
          uStack_258 = 0x12;
          local_278 = "receive_message {}";
          uStack_270 = 0x12;
          local_268 = in_stack_fffffffffffff970;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8
                    );
          local_38 = &local_288;
          local_40 = local_298;
          local_288 = 0xd;
          local_280 = local_40;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb50,in_stack_fffffffffffffb40);
          _Var14 = std::__cxx11::string::operator_cast_to_basic_string_view
                             (in_stack_fffffffffffff8e0);
          uVar17 = _Var14._M_len;
          in_stack_fffffffffffff8d8 = 0;
          logMessageSource_02._M_str = (char *)in_stack_fffffffffffffaa8;
          logMessageSource_02._M_len = in_stack_fffffffffffffaa0;
          message_02._M_len._4_4_ = in_stack_fffffffffffffa94;
          message_02._M_len._0_4_ = in_stack_fffffffffffffa90.gid;
          message_02._M_str = (char *)in_stack_fffffffffffffa98;
          logMessage((FederateState *)in_stack_fffffffffffffa88,
                     (int)((ulong)in_stack_fffffffffffffa80 >> 0x20),logMessageSource_02,message_02,
                     (bool)(char)((ulong)in_stack_fffffffffffffa80 >> 0x18));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8e0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8e0);
        }
        bVar5 = TimeRepresentation<count_time<9,_long>_>::operator<
                          (&local_2a8->actionTime,
                           (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x508));
        if ((bVar5) && (*(char *)(in_RDI + 0x2ff) != '\x02')) {
          _Var14 = std::__cxx11::string::operator_cast_to_basic_string_view
                             (in_stack_fffffffffffff8e0);
          local_500 = (pointer)0x754e3b;
          local_4f8 = (pointer)0x3d;
          in_stack_fffffffffffff968 = local_520;
          prettyPrintString_abi_cxx11_((ActionMessage *)uVar17);
          local_528.internalTimeCode =
               (baseType)
               TimeRepresentation::operator_cast_to_double
                         ((TimeRepresentation<count_time<9,_long>_> *)0x4ed870);
          local_530.internalTimeCode =
               (baseType)
               TimeRepresentation::operator_cast_to_double
                         ((TimeRepresentation<count_time<9,_long>_> *)0x4ed88d);
          local_180 = local_4f0;
          local_190 = local_500;
          psStack_188 = local_4f8;
          local_1a0 = &local_528;
          local_1a8 = &local_530;
          local_1b8 = local_500;
          psStack_1b0 = local_4f8;
          local_198 = in_stack_fffffffffffff968;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8
                    );
          local_58 = local_1e8;
          local_60 = local_1a0->internalTimeCode;
          local_68 = local_1d8;
          local_70 = local_1a8->internalTimeCode;
          local_18 = &local_1c8;
          local_20 = local_1f8;
          local_1c8 = 0xaad;
          local_1e8[0] = local_60;
          local_1d8[0] = local_70;
          local_1c0 = local_20;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb50,(format_args)_Var14);
          local_4d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffff8e0);
          in_stack_fffffffffffff8d8 = 0;
          logMessageSource_03._M_str = (char *)in_stack_fffffffffffffaa8;
          logMessageSource_03._M_len = in_stack_fffffffffffffaa0;
          message_03._M_len._4_4_ = in_stack_fffffffffffffa94;
          message_03._M_len._0_4_ = in_stack_fffffffffffffa90.gid;
          message_03._M_str = (char *)in_stack_fffffffffffffa98;
          logMessage((FederateState *)in_stack_fffffffffffffa88,
                     (int)((ulong)in_stack_fffffffffffffa80 >> 0x20),logMessageSource_03,message_03,
                     (bool)(char)((ulong)in_stack_fffffffffffffa80 >> 0x18));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8e0);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8e0);
        }
        std::make_unique<helics::Message>();
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x4edaef);
        SmallBuffer::operator=
                  (in_stack_fffffffffffff918,
                   (SmallBuffer *)CONCAT44(in_stack_fffffffffffff914.hid,in_stack_fffffffffffff910))
        ;
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x4edb21);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffff8e0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        uVar1 = local_2a8->flags;
        pMVar11 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                  operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                             0x4edb5a);
        pAVar4 = local_2a8;
        pMVar11->flags = uVar1;
        pMVar11 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                  operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                             0x4edb7a);
        (pMVar11->time).internalTimeCode = (pAVar4->actionTime).internalTimeCode;
        uVar2 = local_2a8->counter;
        pMVar11 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                  operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                             0x4edba0);
        pMVar11->counter = (uint)uVar2;
        iVar3 = local_2a8->messageID;
        pMVar11 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                  operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                             0x4edbc3);
        pMVar11->messageID = iVar3;
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x4edbe5);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffff8e0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffff8e0,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
        EndpointInfo::addMessage(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffff8e0);
        FVar6 = std::atomic::operator_cast_to_FederateStates
                          ((atomic<helics::FederateStates> *)0x4edc51);
        if (FVar6 < TERMINATING) {
          pTVar8 = std::
                   unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                   ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                 *)0x4edc66);
          (*(pTVar8->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(pTVar8,local_2a8);
        }
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffff8e0);
      }
    }
    else {
      local_548 = (pointer)((long)GVar9 + 0xb0);
      local_550._M_current =
           (GlobalHandle *)
           std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                     ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                      CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      iVar12 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
                         ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                          CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8));
      while (bVar5 = __gnu_cxx::
                     operator==<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                               ((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                 *)in_stack_fffffffffffff8e0,
                                (__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8)),
            ((bVar5 ^ 0xffU) & 1) != 0) {
        uVar13 = __gnu_cxx::
                 __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                 ::operator*(&local_550);
        uVar17 = (local_2a8->actionTime).internalTimeCode;
        if ((*(char *)(in_RDI + 0x2ff) == '\x02') &&
           (bVar5 = TimeRepresentation<count_time<9,_long>_>::operator<
                              ((TimeRepresentation<count_time<9,_long>_> *)&stack0xfffffffffffffa98,
                               (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x508)), bVar5)
           ) {
          uVar17 = *(undefined8 *)(in_RDI + 0x508);
        }
        id_00.gid = *(BaseType *)uVar13;
        bVar5 = GlobalFederateId::operator==(&local_2a8->source_id,id_00);
        if (bVar5) {
          id.gid = ((InterfaceHandle *)(uVar13 + 4))->hid;
          bVar5 = InterfaceHandle::operator==(&local_2a8->source_handle,(InterfaceHandle)id.gid);
          source_id = in_stack_fffffffffffffa18._4_8_;
          command = in_stack_fffffffffffffba0._M_allocated_capacity;
          if (bVar5) {
            this_01 = *(undefined8 *)uVar13;
            uVar15 = 0;
            this_00 = (TimeCoordinator *)&stack0xfffffffffffffa70;
            source = GVar9;
            uVar18 = uVar17;
            std::make_shared<helics::SmallBuffer_const,helics::SmallBuffer>((SmallBuffer *)this_00);
            bVar5 = InputInfo::addData(in_stack_fffffffffffffa08._0_8_,source_id,
                                       (Time)in_stack_fffffffffffffa08._8_8_,
                                       in_stack_fffffffffffffa04,in_stack_fffffffffffff9f8);
            uVar16 = CONCAT13(bVar5,(int3)in_stack_fffffffffffff914.hid);
            std::shared_ptr<const_helics::SmallBuffer>::~shared_ptr
                      ((shared_ptr<const_helics::SmallBuffer> *)0x4edea6);
            if ((uVar16 & 0x1000000) != 0) {
              if ((*(bool *)((long)GVar9 + 0x6c) & 1U) == 0) {
                local_598 = uVar18;
                std::
                unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
                operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                            *)0x4eded6);
                valueUpdateTime.internalTimeCode._4_4_ = uVar16;
                valueUpdateTime.internalTimeCode._0_4_ = in_stack_fffffffffffff910;
                uVar18 = local_598;
                TimeCoordinator::updateValueTime(this_00,valueUpdateTime,(bool)uVar15);
                if (0x17 < *(int *)(in_RDI + 0x290)) {
                  local_5a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        (in_stack_fffffffffffff8e0);
                  pTVar8 = std::
                           unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                         *)0x4edf4e);
                  in_stack_fffffffffffff8f0 = (InputInfo *)&stack0xfffffffffffffa28;
                  (*(pTVar8->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[0xb])();
                  local_5b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        (in_stack_fffffffffffff8e0);
                  logMessageSource_04._M_str = (char *)iVar12._M_current;
                  logMessageSource_04._M_len = uVar13;
                  message_04._M_len._4_4_ = id_00.gid;
                  message_04._M_len._0_4_ = id.gid;
                  message_04._M_str = (char *)uVar18;
                  logMessage((FederateState *)this_01,(int)((ulong)uVar17 >> 0x20),
                             logMessageSource_04,message_04,(bool)(char)((ulong)uVar17 >> 0x18));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff8e0);
                }
              }
              if (0x11 < *(int *)(in_RDI + 0x290)) {
                std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff8e0);
                local_628 = "receive PUBLICATION {} from {}";
                local_620 = 0x1e;
                prettyPrintString_abi_cxx11_((ActionMessage *)command);
                x = InputInfo::getSourceName_abi_cxx11_(in_stack_fffffffffffff8f0,source);
                local_98 = local_618;
                local_a8 = local_628;
                uStack_a0 = local_620;
                local_b0 = local_648;
                local_c8 = local_628;
                uStack_c0 = local_620;
                local_b8 = x;
                ::fmt::v11::detail::value<fmt::v11::context>::
                value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                          ((value<fmt::v11::context> *)in_stack_fffffffffffff8f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)x);
                ::fmt::v11::detail::value<fmt::v11::context>::
                value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                          ((value<fmt::v11::context> *)in_stack_fffffffffffff8f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)x);
                local_8 = &local_d8;
                local_10 = local_f8;
                local_d8 = 0xdd;
                local_d0 = local_10;
                ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb50,in_stack_fffffffffffffb40);
                std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff8e0);
                logMessageSource_05._M_str = (char *)iVar12._M_current;
                logMessageSource_05._M_len = uVar13;
                message_05._M_len._4_4_ = id_00.gid;
                message_05._M_len._0_4_ = id.gid;
                message_05._M_str = (char *)uVar18;
                logMessage((FederateState *)this_01,(int)((ulong)uVar17 >> 0x20),logMessageSource_05
                           ,message_05,(bool)(char)((ulong)uVar17 >> 0x18));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8e0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8e0);
              }
            }
            break;
          }
        }
        __gnu_cxx::
        __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
        ::operator++(&local_550);
      }
      FVar6 = std::atomic::operator_cast_to_FederateStates
                        ((atomic<helics::FederateStates> *)0x4ee28d);
      if (FVar6 < TERMINATING) {
        pTVar8 = std::
                 unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                               *)0x4ee2a2);
        (*(pTVar8->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(pTVar8,local_2a8);
      }
    }
  }
  else if (aVar7 == cmd_send_message) {
    local_2b4 = (local_2a8->dest_handle).hid;
    local_2b0 = InterfaceInfo::getEndpoint
                          ((InterfaceInfo *)in_stack_fffffffffffff908,in_stack_fffffffffffff914);
    if ((local_2b0 != (EndpointInfo *)0x0) && ((local_2b0->sourceOnly & 1U) == 0)) {
      bVar5 = TimeRepresentation<count_time<9,_long>_>::operator<
                        (&local_2a8->actionTime,
                         (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x518));
      if (bVar5) {
        (local_2a8->actionTime).internalTimeCode = *(baseType *)(in_RDI + 0x518);
      }
      std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
      operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                  *)0x4ece24);
      local_2c0 = (local_2a8->actionTime).internalTimeCode;
      messageUpdateTime.internalTimeCode._4_4_ = in_stack_fffffffffffff914.hid;
      messageUpdateTime.internalTimeCode._0_4_ = in_stack_fffffffffffff910;
      TimeCoordinator::updateMessageTime
                (in_stack_fffffffffffff908,messageUpdateTime,
                 SUB41((uint)in_stack_fffffffffffff904 >> 0x18,0));
      if (0x11 < *(int *)(in_RDI + 0x290)) {
        local_2d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffff8e0);
        local_310 = "receive_message {}";
        local_308 = 0x12;
        prettyPrintString_abi_cxx11_((ActionMessage *)uVar17);
        local_200 = local_300;
        local_210 = local_310;
        uStack_208 = local_308;
        local_228 = local_310;
        uStack_220 = local_308;
        local_218 = local_330;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        local_48 = &local_238;
        local_50 = local_248;
        local_238 = 0xd;
        local_230 = local_50;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb50,in_stack_fffffffffffffb40);
        local_2e0 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffff8e0);
        logMessageSource._M_str = (char *)in_stack_fffffffffffffaa8;
        logMessageSource._M_len = in_stack_fffffffffffffaa0;
        message._M_len._4_4_ = in_stack_fffffffffffffa94;
        message._M_len._0_4_ = in_stack_fffffffffffffa90.gid;
        message._M_str = (char *)in_stack_fffffffffffffa98;
        logMessage((FederateState *)in_stack_fffffffffffffa88,
                   (int)((ulong)in_stack_fffffffffffffa80 >> 0x20),logMessageSource,message,
                   (bool)(char)((ulong)in_stack_fffffffffffffa80 >> 0x18));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8e0);
      }
      bVar5 = TimeRepresentation<count_time<9,_long>_>::operator<
                        (&local_2a8->actionTime,
                         (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x508));
      if ((bVar5) && (*(char *)(in_RDI + 0x2ff) != '\x02')) {
        local_350 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffff8e0);
        local_390 = "received message {} at time({}) earlier than granted time({})";
        local_388 = (__pthread_internal_list *)0x3d;
        prettyPrintString_abi_cxx11_((ActionMessage *)uVar17);
        local_3b8 = (pointer)TimeRepresentation::operator_cast_to_double
                                       ((TimeRepresentation<count_time<9,_long>_> *)0x4ed0fe);
        local_3c0 = (pointer)TimeRepresentation::operator_cast_to_double
                                       ((TimeRepresentation<count_time<9,_long>_> *)0x4ed11b);
        local_100 = local_380;
        local_110 = (__pthread_internal_list *)local_390;
        p_Stack_108 = (__pthread_internal_list *)local_388;
        local_120 = &local_3b8;
        local_128 = &local_3c0;
        local_138 = (__pthread_internal_list *)local_390;
        p_Stack_130 = (__pthread_internal_list *)local_388;
        local_118 = local_3b0;
        ::fmt::v11::detail::value<fmt::v11::context>::
        value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                  ((value<fmt::v11::context> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
        local_78 = local_168;
        local_80 = *local_120;
        local_88 = local_158;
        local_90 = *local_128;
        local_28 = &local_148;
        local_30 = local_178;
        local_148 = 0xaad;
        local_168[0] = local_80;
        local_158[0] = local_90;
        local_140 = local_30;
        ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffb50,in_stack_fffffffffffffb40);
        local_360 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     )std::__cxx11::string::operator_cast_to_basic_string_view
                                (in_stack_fffffffffffff8e0);
        logMessageSource_00._M_str = (char *)in_stack_fffffffffffffaa8;
        logMessageSource_00._M_len = in_stack_fffffffffffffaa0;
        message_00._M_len._4_4_ = in_stack_fffffffffffffa94;
        message_00._M_len._0_4_ = in_stack_fffffffffffffa90.gid;
        message_00._M_str = (char *)in_stack_fffffffffffffa98;
        logMessage((FederateState *)in_stack_fffffffffffffa88,
                   (int)((ulong)in_stack_fffffffffffffa80 >> 0x20),logMessageSource_00,message_00,
                   (bool)(char)((ulong)in_stack_fffffffffffffa80 >> 0x18));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8e0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8e0);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8f0,
                   (char *)in_stack_fffffffffffff8e8);
        processQueryActual_abi_cxx11_(in_stack_00000598,in_stack_000005a0);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                   in_stack_fffffffffffff8f8,(char *)in_stack_fffffffffffff8f0);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff8e0);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff8e0);
        logMessageSource_01._M_str = (char *)in_stack_fffffffffffffaa8;
        logMessageSource_01._M_len = in_stack_fffffffffffffaa0;
        message_01._M_len._4_4_ = in_stack_fffffffffffffa94;
        message_01._M_len._0_4_ = in_stack_fffffffffffffa90.gid;
        message_01._M_str = (char *)in_stack_fffffffffffffa98;
        logMessage((FederateState *)in_stack_fffffffffffffa88,
                   (int)((ulong)in_stack_fffffffffffffa80 >> 0x20),logMessageSource_01,message_01,
                   (bool)(char)((ulong)in_stack_fffffffffffffa80 >> 0x18));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff8e0);
      }
      FVar6 = std::atomic::operator_cast_to_FederateStates
                        ((atomic<helics::FederateStates> *)0x4ed45f);
      if (FVar6 < TERMINATING) {
        pTVar8 = std::
                 unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ::operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                               *)0x4ed474);
        (*(pTVar8->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(pTVar8,local_2a8);
      }
      createMessageFromCommand(in_stack_fffffffffffff958);
      EndpointInfo::addMessage(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffff8e0);
    }
  }
  return;
}

Assistant:

void FederateState::processDataMessage(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_SEND_MESSAGE: {
            auto* epi = interfaceInformation.getEndpoint(cmd.dest_handle);
            if (epi != nullptr && !epi->sourceOnly) {
                if (cmd.actionTime < minimumReceiveTime) {
                    cmd.actionTime = minimumReceiveTime;
                }
                // if (!epi->not_interruptible)
                {
                    timeCoord->updateMessageTime(cmd.actionTime, !timeGranted_mode);
                }
                LOG_DATA(fmt::format("receive_message {}", prettyPrintString(cmd)));
                if (cmd.actionTime < time_granted &&
                    timeMethod != TimeSynchronizationMethod::ASYNC) {
                    LOG_WARNING(
                        fmt::format("received message {} at time({}) earlier than granted time({})",
                                    prettyPrintString(cmd),
                                    static_cast<double>(cmd.actionTime),
                                    static_cast<double>(time_granted)));
                    auto qres = processQueryActual("global_time_debugging");
                    qres.insert(0, "TIME DEBUGGING::");
                    LOG_WARNING(qres);
                }

                if (state <= FederateStates::EXECUTING) {
                    timeCoord->processTimeMessage(cmd);
                }
                epi->addMessage(createMessageFromCommand(std::move(cmd)));
            }
        } break;
        case CMD_PUB: {
            auto* subI = interfaceInformation.getInput(InterfaceHandle(cmd.dest_handle));
            if (subI == nullptr) {
                auto* eptI = interfaceInformation.getEndpoint(cmd.dest_handle);
                if (eptI != nullptr) {
                    // if (!epi->not_interruptible)
                    {
                        timeCoord->updateMessageTime(cmd.actionTime, !timeGranted_mode);
                    }
                    LOG_DATA(fmt::format("receive_message {}", prettyPrintString(cmd)));
                    if (cmd.actionTime < time_granted &&
                        timeMethod != TimeSynchronizationMethod::ASYNC) {
                        LOG_WARNING(fmt::format(
                            "received message {} at time({}) earlier than granted time({})",
                            prettyPrintString(cmd),
                            static_cast<double>(cmd.actionTime),
                            static_cast<double>(time_granted)));
                    }
                    auto mess = std::make_unique<Message>();
                    mess->data = std::move(cmd.payload);
                    mess->dest = eptI->key;
                    mess->flags = cmd.flags;
                    mess->time = cmd.actionTime;
                    mess->counter = cmd.counter;
                    mess->messageID = cmd.messageID;
                    mess->original_dest = eptI->key;
                    eptI->addMessage(std::move(mess));
                    if (state <= FederateStates::EXECUTING) {
                        timeCoord->processTimeMessage(cmd);
                    }
                }
                break;
            }
            for (auto& src : subI->input_sources) {
                auto valueTime = cmd.actionTime;
                if (timeMethod == TimeSynchronizationMethod::ASYNC) {
                    if (valueTime < time_granted) {
                        valueTime = time_granted;
                    }
                }
                if ((cmd.source_id == src.fed_id) && (cmd.source_handle == src.handle)) {
                    if (subI->addData(src,
                                      valueTime,
                                      cmd.counter,
                                      std::make_shared<const SmallBuffer>(
                                          std::move(cmd.payload)))) {
                        if (!subI->not_interruptible) {
                            timeCoord->updateValueTime(valueTime, !timeGranted_mode);
                            LOG_TRACE(timeCoord->printTimeStatus());
                        }
                        LOG_DATA(fmt::format("receive PUBLICATION {} from {}",
                                             prettyPrintString(cmd),
                                             subI->getSourceName(src)));
                    }
                    // this can only match once
                    break;
                }
            }
            if (state <= FederateStates::EXECUTING) {
                timeCoord->processTimeMessage(cmd);
            }
        } break;
        default:
            break;
    }
}